

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnVector<absl::int128>::ColumnVector
          (ColumnVector<absl::int128> *this,
          vector<absl::int128,_std::allocator<absl::int128>_> *data)

{
  undefined8 *in_RDI;
  vector<absl::int128,_std::allocator<absl::int128>_> *in_stack_00000008;
  vector<absl::int128,_std::allocator<absl::int128>_> *in_stack_00000010;
  TypeRef *type;
  Column *in_stack_ffffffffffffffd0;
  TypeRef local_20 [2];
  
  type = local_20;
  Type::CreateSimple<absl::int128>();
  Column::Column(in_stack_ffffffffffffffd0,type);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x218542);
  *in_RDI = &PTR__ColumnVector_002a0578;
  std::vector<absl::int128,_std::allocator<absl::int128>_>::vector
            (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector(const std::vector<T>& data)
    : Column(Type::CreateSimple<T>())
    , data_(data)
{
}